

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

int __thiscall procxx::pipe_t::close(pipe_t *this,int __fd)

{
  int iVar1;
  pipe_end pVar2;
  pipe_end pVar3;
  
  pVar2 = read_end();
  iVar1 = (this->pipe_)._M_elems[pVar2.end_];
  if (iVar1 != -1) {
    ::close(iVar1);
    (this->pipe_)._M_elems[pVar2.end_] = -1;
  }
  pVar3 = write_end();
  iVar1 = (this->pipe_)._M_elems[pVar3.end_];
  pVar2 = pVar3;
  if (iVar1 != -1) {
    pVar2.end_ = ::close(iVar1);
    (this->pipe_)._M_elems[pVar3.end_] = -1;
  }
  return pVar2.end_;
}

Assistant:

void close() {
    close(read_end());
    close(write_end());
  }